

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void q_createNativeChildrenAndSetParent(QWidget *parentWidget)

{
  long lVar1;
  QObject **ppQVar2;
  ulong uVar3;
  QObject *object;
  QWidget *pQVar4;
  QWindow *pQVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QObject_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&parentWidget->field_0x8;
  local_50.d = *(Data **)(lVar1 + 0x18);
  ppQVar2 = *(QObject ***)(lVar1 + 0x20);
  uVar3 = *(ulong *)(lVar1 + 0x28);
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.ptr = ppQVar2;
  local_50.size = uVar3;
  for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    object = ppQVar2[uVar6];
    if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
      pQVar4 = QtPrivate::qobject_cast_helper<QWidget_const*,QObject>(object);
      if (pQVar4 != (QWidget *)0x0) {
        if ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x248) & 0x10) == 0) {
          q_createNativeChildrenAndSetParent(pQVar4);
        }
        else {
          if (pQVar4->data->winid == 0) {
            QWidget::winId(pQVar4);
          }
          pQVar5 = QWidget::windowHandle(pQVar4);
          if (pQVar5 != (QWindow *)0x0) {
            if (((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
              pQVar4 = QWidget::nativeParentWidget(pQVar4);
              QWidget::windowHandle(pQVar4);
              QWindow::setParent(pQVar5);
            }
            else {
              pQVar4 = QWidget::window(parentWidget);
              QWidget::windowHandle(pQVar4);
              QWindow::setTransientParent(pQVar5);
            }
          }
        }
      }
    }
  }
  QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_createNativeChildrenAndSetParent(const QWidget *parentWidget)
{
    QObjectList children = parentWidget->children();
    for (int i = 0; i < children.size(); i++) {
        if (children.at(i)->isWidgetType()) {
            const QWidget *childWidget = qobject_cast<const QWidget *>(children.at(i));
            if (childWidget) { // should not be necessary
                if (childWidget->testAttribute(Qt::WA_NativeWindow)) {
                    if (!childWidget->internalWinId())
                        childWidget->winId();
                    if (childWidget->windowHandle()) {
                        if (childWidget->isWindow()) {
                            childWidget->windowHandle()->setTransientParent(parentWidget->window()->windowHandle());
                        } else {
                            childWidget->windowHandle()->setParent(childWidget->nativeParentWidget()->windowHandle());
                        }
                    }
                } else {
                    q_createNativeChildrenAndSetParent(childWidget);
                }
            }
        }
    }

}